

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

void spki_table_free(spki_table *spki_table)

{
  pthread_rwlock_t *__rwlock;
  long lVar1;
  tommy_foreach_func *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __rwlock = &spki_table->lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  tommy_list_foreach(&spki_table->list,in_RSI);
  tommy_hashlin_done(&spki_table->hashtable);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_destroy((pthread_rwlock_t *)__rwlock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void spki_table_free(struct spki_table *spki_table)
{
	pthread_rwlock_wrlock(&spki_table->lock);

	tommy_list_foreach(&spki_table->list, free);
	tommy_hashlin_done(&spki_table->hashtable);

	pthread_rwlock_unlock(&spki_table->lock);
	pthread_rwlock_destroy(&spki_table->lock);
}